

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

char * anon_unknown.dwarf_1a4ea1::ReadString(string *s,char *ptr)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = ptr;
  do {
    pcVar2 = pcVar1;
    pcVar1 = pcVar2 + 1;
  } while (*pcVar2 != '\0');
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,ptr,pcVar2);
  std::__cxx11::string::operator=((string *)s,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return pcVar2 + 1;
}

Assistant:

const char *ReadString(std::string &s, const char *ptr) {
  // Read untile NULL(\0).
  const char *p = ptr;
  const char *q = ptr;
  while ((*q) != 0)
    q++;

  s = std::string(p, q);

  return q + 1; // skip '\0'
}